

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSimSat.c
# Opt level: O1

void Dch_ManResimulateCex2(Dch_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t *pRepr)

{
  Aig_Obj_t **ppAVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  long lVar4;
  Vec_Ptr_t *vRoots;
  long lVar5;
  timespec ts;
  timespec local_38;
  
  iVar2 = clock_gettime(3,&local_38);
  if (iVar2 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  ppAVar1 = p->pAigTotal->pReprs;
  if (ppAVar1 == (Aig_Obj_t **)0x0) {
    pAVar3 = (Aig_Obj_t *)0x0;
  }
  else {
    pAVar3 = ppAVar1[pObj->Id];
  }
  if (pAVar3 == p->pAigTotal->pConst1) {
    Dch_ClassesCollectConst1Group(p->ppClasses,pObj,500,p->vSimRoots);
  }
  else {
    Dch_ClassesCollectOneClass(p->ppClasses,pRepr,p->vSimRoots);
  }
  p->nConeThis = 0;
  Aig_ManIncrementTravId(p->pAigTotal);
  p->pAigTotal->pConst1->TravId = p->pAigTotal->nTravIds;
  Dch_ManResimulateSolved_rec(p,pObj);
  Dch_ManResimulateSolved_rec(p,pRepr);
  iVar2 = p->nConeThis;
  if (p->nConeThis < p->nConeMax) {
    iVar2 = p->nConeMax;
  }
  p->nConeMax = iVar2;
  vRoots = p->vSimRoots;
  if (0 < vRoots->nSize) {
    lVar5 = 0;
    do {
      Dch_ManResimulateOther_rec(p,(Aig_Obj_t *)vRoots->pArray[lVar5]);
      lVar5 = lVar5 + 1;
      vRoots = p->vSimRoots;
    } while (lVar5 < vRoots->nSize);
  }
  ppAVar1 = p->pAigTotal->pReprs;
  if (ppAVar1 == (Aig_Obj_t **)0x0) {
    pAVar3 = (Aig_Obj_t *)0x0;
  }
  else {
    pAVar3 = ppAVar1[pObj->Id];
  }
  if (pAVar3 == p->pAigTotal->pConst1) {
    iVar2 = Dch_ClassesRefineConst1Group(p->ppClasses,vRoots,0);
  }
  else {
    iVar2 = Dch_ClassesRefineOneClass(p->ppClasses,pRepr,0);
  }
  if (iVar2 != 0) {
    iVar2 = clock_gettime(3,&local_38);
    if (iVar2 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
    }
    p->timeSimSat = p->timeSimSat + lVar5 + lVar4;
    return;
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/dch/dchSimSat.c"
                ,0xfa,"void Dch_ManResimulateCex2(Dch_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

void Dch_ManResimulateCex2( Dch_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t * pRepr )
{
    Aig_Obj_t * pRoot;
    int i, RetValue;
    abctime clk = Abc_Clock();
    // get the equivalence class
    if ( Dch_ObjIsConst1Cand(p->pAigTotal, pObj) )
        Dch_ClassesCollectConst1Group( p->ppClasses, pObj, 500, p->vSimRoots );
    else
        Dch_ClassesCollectOneClass( p->ppClasses, pRepr, p->vSimRoots );
    // resimulate the cone of influence of the solved nodes
    p->nConeThis = 0;
    Aig_ManIncrementTravId( p->pAigTotal );
    Aig_ObjSetTravIdCurrent( p->pAigTotal, Aig_ManConst1(p->pAigTotal) );
    Dch_ManResimulateSolved_rec( p, pObj );
    Dch_ManResimulateSolved_rec( p, pRepr );
    p->nConeMax = Abc_MaxInt( p->nConeMax, p->nConeThis );
    // resimulate the cone of influence of the other nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vSimRoots, pRoot, i )
        Dch_ManResimulateOther_rec( p, pRoot );
    // refine this class
    if ( Dch_ObjIsConst1Cand(p->pAigTotal, pObj) )
        RetValue = Dch_ClassesRefineConst1Group( p->ppClasses, p->vSimRoots, 0 );
    else
        RetValue = Dch_ClassesRefineOneClass( p->ppClasses, pRepr, 0 );
    assert( RetValue );
p->timeSimSat += Abc_Clock() - clk;
}